

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O3

void cftf1st(int n,double *a,double *w)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  
  iVar9 = n >> 3;
  lVar6 = (long)(iVar9 * 2);
  dVar18 = a[iVar9 * 4];
  dVar20 = (a + iVar9 * 4)[1];
  dVar25 = *a - dVar18;
  dVar28 = a[1] - dVar20;
  dVar32 = a[lVar6];
  dVar33 = (a + lVar6)[1];
  dVar31 = a[iVar9 * 6];
  dVar19 = (a + iVar9 * 6)[1];
  dVar34 = dVar32 - dVar31;
  dVar35 = dVar33 - dVar19;
  dVar18 = *a + dVar18;
  dVar20 = a[1] + dVar20;
  dVar32 = dVar32 + dVar31;
  dVar33 = dVar33 + dVar19;
  *a = dVar18 + dVar32;
  a[1] = dVar20 + dVar33;
  a[lVar6] = dVar18 - dVar32;
  (a + lVar6)[1] = dVar20 - dVar33;
  a[iVar9 * 4] = dVar25 - dVar35;
  (a + iVar9 * 4)[1] = dVar34 + dVar28;
  a[iVar9 * 6] = dVar35 + dVar25;
  (a + iVar9 * 6)[1] = dVar28 - dVar34;
  dVar18 = w[1];
  dVar20 = w[2];
  dVar32 = w[3];
  uVar5 = (ulong)(iVar9 - 2U);
  if (iVar9 < 5) {
    uVar5 = (ulong)(int)(iVar9 - 2U);
    dVar31 = 0.0;
    dVar33 = 1.0;
    dVar19 = 1.0;
    dVar25 = 0.0;
  }
  else {
    lVar10 = lVar6 + -2;
    lVar13 = lVar6 * 0x10 + -0x10;
    lVar14 = lVar6 * 0x20 + -0x10;
    lVar8 = lVar6 * 0x18 + -0x10;
    lVar16 = 4;
    dVar28 = 0.0;
    dVar34 = 1.0;
    dVar35 = 0.0;
    dVar36 = 1.0;
    lVar12 = lVar6 * 0x10;
    lVar2 = lVar6 * 0x18;
    do {
      lVar15 = lVar2 + 0x20;
      lVar11 = lVar12 + 0x20;
      lVar7 = lVar6 + 4;
      dVar33 = w[lVar16];
      dVar31 = w[lVar16 + 1];
      dVar19 = w[lVar16 + 2];
      dVar25 = w[lVar16 + 3];
      dVar37 = a[lVar16 + -2];
      dVar38 = (a + lVar16 + -2)[1];
      dVar26 = a[lVar16];
      dVar29 = (a + lVar16)[1];
      pdVar1 = (double *)((long)a + lVar12 + 0x10);
      dVar44 = *pdVar1;
      dVar49 = pdVar1[1];
      dVar21 = dVar37 + dVar44;
      dVar23 = dVar38 + dVar49;
      dVar48 = a[lVar6 + 2];
      dVar50 = (a + lVar6 + 2)[1];
      pdVar1 = (double *)((long)a + lVar2 + 0x10);
      dVar22 = *pdVar1;
      dVar24 = pdVar1[1];
      dVar41 = dVar48 + dVar22;
      dVar42 = dVar50 + dVar24;
      dVar3 = *(double *)((long)a + lVar11);
      dVar4 = ((double *)((long)a + lVar11))[1];
      dVar39 = a[lVar7];
      dVar40 = (a + lVar7)[1];
      dVar27 = *(double *)((long)a + lVar15);
      dVar30 = ((double *)((long)a + lVar15))[1];
      a[lVar16 + -2] = dVar41 + dVar21;
      (a + lVar16 + -2)[1] = dVar42 + dVar23;
      dVar43 = dVar26 + dVar3;
      dVar45 = dVar29 + dVar4;
      dVar46 = dVar39 + dVar27;
      dVar47 = dVar40 + dVar30;
      a[lVar16] = dVar43 + dVar46;
      (a + lVar16)[1] = dVar45 + dVar47;
      a[lVar6 + 2] = dVar21 - dVar41;
      (a + lVar6 + 2)[1] = dVar23 - dVar42;
      a[lVar7] = dVar43 - dVar46;
      (a + lVar7)[1] = dVar45 - dVar47;
      dVar23 = (dVar36 + dVar33) * dVar20;
      dVar41 = (dVar35 + dVar31) * dVar20;
      dVar37 = dVar37 - dVar44;
      dVar38 = dVar38 - dVar49;
      dVar48 = dVar48 - dVar22;
      dVar50 = dVar50 - dVar24;
      dVar35 = dVar37 - dVar50;
      dVar36 = dVar38 - dVar48;
      dVar50 = dVar50 + dVar37;
      dVar48 = dVar48 + dVar38;
      dVar21 = (dVar34 + dVar19) * dVar32;
      dVar42 = (dVar28 + dVar25) * dVar32;
      pdVar1 = (double *)((long)a + lVar12 + 0x10);
      *pdVar1 = dVar23 * dVar35 + -dVar41 * dVar48;
      pdVar1[1] = dVar23 * dVar48 + dVar41 * dVar35;
      dVar26 = dVar26 - dVar3;
      dVar29 = dVar29 - dVar4;
      dVar39 = dVar39 - dVar27;
      dVar40 = dVar40 - dVar30;
      dVar28 = dVar26 - dVar40;
      dVar34 = dVar29 - dVar39;
      dVar40 = dVar40 + dVar26;
      dVar39 = dVar39 + dVar29;
      *(double *)((long)a + lVar11) = dVar33 * dVar28 + -dVar31 * dVar39;
      ((double *)((long)a + lVar11))[1] = dVar33 * dVar39 + dVar31 * dVar28;
      pdVar1 = (double *)((long)a + lVar2 + 0x10);
      *pdVar1 = dVar21 * dVar50 + dVar42 * dVar36;
      pdVar1[1] = dVar21 * dVar36 + -dVar42 * dVar50;
      *(double *)((long)a + lVar15) = dVar19 * dVar40 + dVar34 * dVar25;
      ((double *)((long)a + lVar15))[1] = dVar19 * dVar34 + dVar40 * -dVar25;
      dVar28 = a[lVar10 + -2];
      dVar34 = (a + lVar10 + -2)[1];
      dVar35 = a[lVar10];
      dVar36 = (a + lVar10)[1];
      dVar37 = *(double *)((long)a + lVar8);
      dVar38 = ((double *)((long)a + lVar8))[1];
      dVar26 = *(double *)((long)a + lVar13);
      dVar29 = ((double *)((long)a + lVar13))[1];
      dVar44 = *(double *)((long)a + lVar14);
      dVar49 = ((double *)((long)a + lVar14))[1];
      dVar39 = dVar35 + dVar37;
      dVar40 = dVar36 + dVar38;
      dVar27 = dVar26 + dVar44;
      dVar30 = dVar29 + dVar49;
      pdVar1 = (double *)((long)a + lVar8 + -0x10);
      dVar48 = *pdVar1;
      dVar50 = pdVar1[1];
      pdVar1 = (double *)((long)a + lVar13 + -0x10);
      dVar22 = *pdVar1;
      dVar24 = pdVar1[1];
      pdVar1 = (double *)((long)a + lVar14 + -0x10);
      dVar3 = *pdVar1;
      dVar4 = pdVar1[1];
      a[lVar10] = dVar27 + dVar39;
      (a + lVar10)[1] = dVar30 + dVar40;
      dVar43 = dVar28 + dVar48;
      dVar45 = dVar34 + dVar50;
      dVar46 = dVar22 + dVar3;
      dVar47 = dVar24 + dVar4;
      a[lVar10 + -2] = dVar43 + dVar46;
      (a + lVar10 + -2)[1] = dVar45 + dVar47;
      *(double *)((long)a + lVar13) = dVar39 - dVar27;
      ((double *)((long)a + lVar13))[1] = dVar40 - dVar30;
      pdVar1 = (double *)((long)a + lVar13 + -0x10);
      *pdVar1 = dVar43 - dVar46;
      pdVar1[1] = dVar45 - dVar47;
      dVar28 = dVar28 - dVar48;
      dVar34 = dVar34 - dVar50;
      dVar22 = dVar22 - dVar3;
      dVar24 = dVar24 - dVar4;
      dVar48 = dVar28 - dVar24;
      dVar50 = dVar34 - dVar22;
      dVar24 = dVar24 + dVar28;
      dVar22 = dVar22 + dVar34;
      pdVar1 = (double *)((long)a + lVar8 + -0x10);
      *pdVar1 = dVar31 * dVar48 + -dVar33 * dVar22;
      pdVar1[1] = dVar31 * dVar22 + dVar33 * dVar48;
      dVar35 = dVar35 - dVar37;
      dVar36 = dVar36 - dVar38;
      dVar26 = dVar26 - dVar44;
      dVar29 = dVar29 - dVar49;
      dVar28 = dVar35 - dVar29;
      dVar34 = dVar36 - dVar26;
      dVar29 = dVar29 + dVar35;
      dVar26 = dVar26 + dVar36;
      *(double *)((long)a + lVar8) = dVar41 * dVar28 + -dVar23 * dVar26;
      ((double *)((long)a + lVar8))[1] = dVar41 * dVar26 + dVar23 * dVar28;
      *(double *)((long)a + lVar14) = dVar42 * dVar29 + dVar21 * dVar34;
      ((double *)((long)a + lVar14))[1] = dVar42 * dVar34 + -dVar21 * dVar29;
      pdVar1 = (double *)((long)a + lVar14 + -0x10);
      *pdVar1 = dVar25 * dVar24 + dVar50 * dVar19;
      pdVar1[1] = dVar25 * dVar50 + dVar24 * -dVar19;
      lVar10 = lVar10 + -4;
      lVar13 = lVar13 + -0x20;
      lVar14 = lVar14 + -0x20;
      lVar8 = lVar8 + -0x20;
      uVar17 = lVar16 + 2;
      lVar16 = lVar16 + 4;
      dVar28 = dVar25;
      dVar34 = dVar19;
      dVar35 = dVar31;
      dVar36 = dVar33;
      lVar6 = lVar7;
      lVar12 = lVar11;
      lVar2 = lVar15;
    } while (uVar17 < uVar5);
  }
  dVar49 = (dVar33 + dVar18) * dVar20;
  dVar20 = (dVar31 + dVar18) * dVar20;
  dVar44 = (dVar19 - dVar18) * dVar32;
  dVar32 = (dVar25 - dVar18) * dVar32;
  lVar10 = (long)(iVar9 * 5);
  lVar13 = (long)(iVar9 * 3);
  lVar6 = (long)(iVar9 * 7);
  dVar19 = a[lVar10 + -2];
  dVar25 = (a + lVar10 + -2)[1];
  dVar33 = a[uVar5];
  dVar31 = a[(long)iVar9 + -1];
  dVar37 = dVar33 + dVar19;
  dVar38 = dVar31 + dVar25;
  dVar28 = a[lVar13 + -2];
  dVar34 = (a + lVar13 + -2)[1];
  dVar35 = a[lVar6 + -2];
  dVar36 = (a + lVar6 + -2)[1];
  dVar26 = dVar28 + dVar35;
  dVar29 = dVar34 + dVar36;
  a[uVar5] = dVar37 + dVar26;
  a[(long)iVar9 + -1] = dVar38 + dVar29;
  a[lVar13 + -2] = dVar37 - dVar26;
  (a + lVar13 + -2)[1] = dVar38 - dVar29;
  dVar33 = dVar33 - dVar19;
  dVar31 = dVar31 - dVar25;
  dVar28 = dVar28 - dVar35;
  dVar34 = dVar34 - dVar36;
  dVar19 = dVar33 - dVar34;
  dVar25 = dVar31 - dVar28;
  dVar34 = dVar34 + dVar33;
  dVar28 = dVar28 + dVar31;
  a[lVar10 + -2] = dVar49 * dVar19 + -dVar20 * dVar28;
  (a + lVar10 + -2)[1] = dVar49 * dVar28 + dVar20 * dVar19;
  a[lVar6 + -2] = dVar44 * dVar34 + dVar32 * dVar25;
  (a + lVar6 + -2)[1] = dVar44 * dVar25 + -dVar32 * dVar34;
  dVar33 = a[iVar9];
  dVar31 = (a + iVar9)[1];
  dVar19 = a[lVar10];
  dVar25 = (a + lVar10)[1];
  dVar38 = dVar33 + dVar19;
  dVar26 = dVar31 + dVar25;
  dVar33 = dVar33 - dVar19;
  dVar31 = dVar31 - dVar25;
  dVar19 = a[lVar13];
  dVar25 = (a + lVar13)[1];
  dVar28 = a[lVar6];
  dVar34 = (a + lVar6)[1];
  dVar37 = dVar19 - dVar28;
  dVar36 = dVar25 - dVar34;
  dVar35 = dVar33 - dVar36;
  dVar36 = dVar36 + dVar33;
  dVar19 = dVar19 + dVar28;
  dVar25 = dVar25 + dVar34;
  a[iVar9] = dVar38 + dVar19;
  (a + iVar9)[1] = dVar26 + dVar25;
  a[lVar13] = dVar38 - dVar19;
  (a + lVar13)[1] = dVar26 - dVar25;
  dVar33 = dVar31 + dVar37;
  a[lVar10] = (dVar35 - dVar33) * dVar18;
  a[lVar10 + 1] = (dVar33 + dVar35) * dVar18;
  dVar31 = dVar31 - dVar37;
  a[lVar6] = (dVar31 + dVar36) * -dVar18;
  a[lVar6 + 1] = (dVar31 - dVar36) * -dVar18;
  dVar18 = a[(long)iVar9 + 2];
  dVar33 = (a + (long)iVar9 + 2)[1];
  dVar31 = a[lVar10 + 2];
  dVar19 = (a + lVar10 + 2)[1];
  dVar36 = dVar18 + dVar31;
  dVar37 = dVar33 + dVar19;
  dVar25 = a[lVar13 + 2];
  dVar28 = (a + lVar13 + 2)[1];
  dVar34 = a[lVar6 + 2];
  dVar35 = (a + lVar6 + 2)[1];
  dVar38 = dVar25 + dVar34;
  dVar26 = dVar28 + dVar35;
  a[(long)iVar9 + 2] = dVar36 + dVar38;
  (a + (long)iVar9 + 2)[1] = dVar37 + dVar26;
  a[lVar13 + 2] = dVar36 - dVar38;
  (a + lVar13 + 2)[1] = dVar37 - dVar26;
  dVar18 = dVar18 - dVar31;
  dVar33 = dVar33 - dVar19;
  dVar25 = dVar25 - dVar34;
  dVar28 = dVar28 - dVar35;
  dVar31 = dVar18 - dVar28;
  dVar19 = dVar33 - dVar25;
  dVar28 = dVar28 + dVar18;
  dVar25 = dVar25 + dVar33;
  a[lVar10 + 2] = dVar20 * dVar31 + -dVar49 * dVar25;
  (a + lVar10 + 2)[1] = dVar20 * dVar25 + dVar49 * dVar31;
  a[lVar6 + 2] = dVar32 * dVar28 + dVar44 * dVar19;
  (a + lVar6 + 2)[1] = dVar32 * dVar19 + -dVar44 * dVar28;
  return;
}

Assistant:

void cftf1st(int n, double *a, double *w) {
  int j, j0, j1, j2, j3, k, m, mh;
  double wn4r, csc1, csc3, wk1r, wk1i, wk3r, wk3i,
    wd1r, wd1i, wd3r, wd3i;
  double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i,
    y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i;

  mh = n >> 3;
  m = 2 * mh;
  j1 = m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[0] + a[j2];
  x0i = a[1] + a[j2 + 1];
  x1r = a[0] - a[j2];
  x1i = a[1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[0] = x0r + x2r;
  a[1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  a[j2] = x1r - x3i;
  a[j2 + 1] = x1i + x3r;
  a[j3] = x1r + x3i;
  a[j3 + 1] = x1i - x3r;
  wn4r = w[1];
  csc1 = w[2];
  csc3 = w[3];
  wd1r = 1;
  wd1i = 0;
  wd3r = 1;
  wd3i = 0;
  k = 0;
  for (j = 2; j < mh - 2; j += 4) {
    k += 4;
    wk1r = csc1 * (wd1r + w[k]);
    wk1i = csc1 * (wd1i + w[k + 1]);
    wk3r = csc3 * (wd3r + w[k + 2]);
    wk3i = csc3 * (wd3i + w[k + 3]);
    wd1r = w[k];
    wd1i = w[k + 1];
    wd3r = w[k + 2];
    wd3i = w[k + 3];
    j1 = j + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j] + a[j2];
    x0i = a[j + 1] + a[j2 + 1];
    x1r = a[j] - a[j2];
    x1i = a[j + 1] - a[j2 + 1];
    y0r = a[j + 2] + a[j2 + 2];
    y0i = a[j + 3] + a[j2 + 3];
    y1r = a[j + 2] - a[j2 + 2];
    y1i = a[j + 3] - a[j2 + 3];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    y2r = a[j1 + 2] + a[j3 + 2];
    y2i = a[j1 + 3] + a[j3 + 3];
    y3r = a[j1 + 2] - a[j3 + 2];
    y3i = a[j1 + 3] - a[j3 + 3];
    a[j] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    a[j + 2] = y0r + y2r;
    a[j + 3] = y0i + y2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    a[j1 + 2] = y0r - y2r;
    a[j1 + 3] = y0i - y2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1r * x0r - wk1i * x0i;
    a[j2 + 1] = wk1r * x0i + wk1i * x0r;
    x0r = y1r - y3i;
    x0i = y1i + y3r;
    a[j2 + 2] = wd1r * x0r - wd1i * x0i;
    a[j2 + 3] = wd1r * x0i + wd1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3r * x0r + wk3i * x0i;
    a[j3 + 1] = wk3r * x0i - wk3i * x0r;
    x0r = y1r + y3i;
    x0i = y1i - y3r;
    a[j3 + 2] = wd3r * x0r + wd3i * x0i;
    a[j3 + 3] = wd3r * x0i - wd3i * x0r;
    j0 = m - j;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] + a[j2];
    x0i = a[j0 + 1] + a[j2 + 1];
    x1r = a[j0] - a[j2];
    x1i = a[j0 + 1] - a[j2 + 1];
    y0r = a[j0 - 2] + a[j2 - 2];
    y0i = a[j0 - 1] + a[j2 - 1];
    y1r = a[j0 - 2] - a[j2 - 2];
    y1i = a[j0 - 1] - a[j2 - 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    y2r = a[j1 - 2] + a[j3 - 2];
    y2i = a[j1 - 1] + a[j3 - 1];
    y3r = a[j1 - 2] - a[j3 - 2];
    y3i = a[j1 - 1] - a[j3 - 1];
    a[j0] = x0r + x2r;
    a[j0 + 1] = x0i + x2i;
    a[j0 - 2] = y0r + y2r;
    a[j0 - 1] = y0i + y2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    a[j1 - 2] = y0r - y2r;
    a[j1 - 1] = y0i - y2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1i * x0r - wk1r * x0i;
    a[j2 + 1] = wk1i * x0i + wk1r * x0r;
    x0r = y1r - y3i;
    x0i = y1i + y3r;
    a[j2 - 2] = wd1i * x0r - wd1r * x0i;
    a[j2 - 1] = wd1i * x0i + wd1r * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3i * x0r + wk3r * x0i;
    a[j3 + 1] = wk3i * x0i - wk3r * x0r;
    x0r = y1r + y3i;
    x0i = y1i - y3r;
    a[j3 - 2] = wd3i * x0r + wd3r * x0i;
    a[j3 - 1] = wd3i * x0i - wd3r * x0r;
  }
  wk1r = csc1 * (wd1r + wn4r);
  wk1i = csc1 * (wd1i + wn4r);
  wk3r = csc3 * (wd3r - wn4r);
  wk3i = csc3 * (wd3i - wn4r);
  j0 = mh;
  j1 = j0 + m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[j0 - 2] + a[j2 - 2];
  x0i = a[j0 - 1] + a[j2 - 1];
  x1r = a[j0 - 2] - a[j2 - 2];
  x1i = a[j0 - 1] - a[j2 - 1];
  x2r = a[j1 - 2] + a[j3 - 2];
  x2i = a[j1 - 1] + a[j3 - 1];
  x3r = a[j1 - 2] - a[j3 - 2];
  x3i = a[j1 - 1] - a[j3 - 1];
  a[j0 - 2] = x0r + x2r;
  a[j0 - 1] = x0i + x2i;
  a[j1 - 2] = x0r - x2r;
  a[j1 - 1] = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[j2 - 2] = wk1r * x0r - wk1i * x0i;
  a[j2 - 1] = wk1r * x0i + wk1i * x0r;
  x0r = x1r + x3i;
  x0i = x1i - x3r;
  a[j3 - 2] = wk3r * x0r + wk3i * x0i;
  a[j3 - 1] = wk3r * x0i - wk3i * x0r;
  x0r = a[j0] + a[j2];
  x0i = a[j0 + 1] + a[j2 + 1];
  x1r = a[j0] - a[j2];
  x1i = a[j0 + 1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[j0] = x0r + x2r;
  a[j0 + 1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[j2] = wn4r * (x0r - x0i);
  a[j2 + 1] = wn4r * (x0i + x0r);
  x0r = x1r + x3i;
  x0i = x1i - x3r;
  a[j3] = -wn4r * (x0r + x0i);
  a[j3 + 1] = -wn4r * (x0i - x0r);
  x0r = a[j0 + 2] + a[j2 + 2];
  x0i = a[j0 + 3] + a[j2 + 3];
  x1r = a[j0 + 2] - a[j2 + 2];
  x1i = a[j0 + 3] - a[j2 + 3];
  x2r = a[j1 + 2] + a[j3 + 2];
  x2i = a[j1 + 3] + a[j3 + 3];
  x3r = a[j1 + 2] - a[j3 + 2];
  x3i = a[j1 + 3] - a[j3 + 3];
  a[j0 + 2] = x0r + x2r;
  a[j0 + 3] = x0i + x2i;
  a[j1 + 2] = x0r - x2r;
  a[j1 + 3] = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[j2 + 2] = wk1i * x0r - wk1r * x0i;
  a[j2 + 3] = wk1i * x0i + wk1r * x0r;
  x0r = x1r + x3i;
  x0i = x1i - x3r;
  a[j3 + 2] = wk3i * x0r + wk3r * x0i;
  a[j3 + 3] = wk3i * x0i - wk3r * x0r;
}